

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_imexmri.c
# Opt level: O3

int AdvectionJac(sunrealtype c,SUNMatrix Jac,UserData udata)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  lVar2 = udata->N;
  if (2 < lVar2) {
    dVar4 = udata->dx;
    dVar5 = (udata->au * -0.5) / dVar4;
    dVar6 = (udata->av * -0.5) / dVar4;
    dVar4 = (udata->aw * -0.5) / dVar4;
    lVar1 = *(long *)((long)Jac->content + 0x28);
    lVar2 = lVar2 + -2;
    plVar3 = (long *)(*(long *)((long)Jac->content + 0x40) + 0x40);
    do {
      *(double *)(plVar3[-8] + 0x18 + lVar1 * 8) =
           *(double *)(plVar3[-8] + 0x18 + lVar1 * 8) - dVar5;
      *(double *)(plVar3[-7] + 0x18 + lVar1 * 8) =
           *(double *)(plVar3[-7] + 0x18 + lVar1 * 8) - dVar6;
      *(double *)(plVar3[-6] + 0x18 + lVar1 * 8) =
           *(double *)(plVar3[-6] + 0x18 + lVar1 * 8) - dVar4;
      *(double *)(plVar3[-2] + -0x18 + lVar1 * 8) =
           *(double *)(plVar3[-2] + -0x18 + lVar1 * 8) + dVar5;
      *(double *)(plVar3[-1] + -0x18 + lVar1 * 8) =
           *(double *)(plVar3[-1] + -0x18 + lVar1 * 8) + dVar6;
      *(double *)(*plVar3 + -0x18 + lVar1 * 8) = *(double *)(*plVar3 + -0x18 + lVar1 * 8) + dVar4;
      plVar3 = plVar3 + 3;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return (int)lVar2;
}

Assistant:

static int AdvectionJac(sunrealtype c, SUNMatrix Jac, UserData udata)
{
  /* Set shortcuts */
  sunindextype N = udata->N;
  sunrealtype dx = udata->dx;
  sunrealtype au = udata->au;
  sunrealtype av = udata->av;
  sunrealtype aw = udata->aw;
  sunindextype i;
  sunrealtype auconst, avconst, awconst;
  auconst = -au / TWO / dx;
  avconst = -av / TWO / dx;
  awconst = -aw / TWO / dx;

  /* iterate over intervals, filling in Jacobian of (L*y) using SM_ELEMENT_B
     macro (see sunmatrix_band.h) */
  for (i = 1; i < N - 1; i++)
  {
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i - 1, 0)) += -c * auconst;
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i - 1, 1)) += -c * avconst;
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i - 1, 2)) += -c * awconst;
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i + 1, 0)) += c * auconst;
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i + 1, 1)) += c * avconst;
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i + 1, 2)) += c * awconst;
  }

  /* Return with success */
  return 0;
}